

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::_::RawSchema*>::addAll<capnp::_::RawSchema**,true>
          (ArrayBuilder<capnp::_::RawSchema*> *this,RawSchema **start,RawSchema **end)

{
  RawSchema **ppRVar1;
  RawSchema **end_local;
  RawSchema **start_local;
  ArrayBuilder<capnp::_::RawSchema_*> *this_local;
  
  ppRVar1 = _::CopyConstructArray_<capnp::_::RawSchema_*,_capnp::_::RawSchema_**,_true,_false>::
            apply(*(RawSchema ***)(this + 8),start,end);
  *(RawSchema ***)(this + 8) = ppRVar1;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}